

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall blc::network::Socket::setBlock(Socket *this,bool block)

{
  int iVar1;
  undefined8 uVar2;
  int *piVar3;
  byte in_SIL;
  long in_RDI;
  int ret;
  string *in_stack_00000178;
  exception *in_stack_00000180;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  *(byte *)(in_RDI + 0x34) = in_SIL & 1;
  iVar1 = fcntl(*(int *)(in_RDI + 8),4,
                (ulong)(*(uint *)(in_RDI + 0x38) |
                       (1 - (uint)(*(byte *)(in_RDI + 0x34) & 1)) * 0x800));
  if (iVar1 == -1) {
    uVar2 = __cxa_allocate_exception(0x78);
    piVar3 = __errno_location();
    strerror(*piVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    error::exception::exception(in_stack_00000180,in_stack_00000178);
    __cxa_throw(uVar2,&error::exception::typeinfo,error::exception::~exception);
  }
  return;
}

Assistant:

void blc::network::Socket::setBlock(bool block) {
	int ret;

	this->_block = block;
	#ifdef __linux__
		ret = fcntl(this->_socket, F_SETFL, this->_mode | (SOCK_NONBLOCK * (1 - this->_block)));
	#elif __WIN32
		u_long mode = !block;
		ret = ioctlsocket(this->_socket, FIONBIO, &mode);
	#else
		ret = fcntl(this->_socket, F_SETFL, this->_mode | (SOCK_NONBLOCK * (1 - this->_block)));
	#endif
	if (ret == -1)
		throw blc::error::exception(strerror(errno));
}